

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Chapters::ExpandChaptersArray(Chapters *this)

{
  int iVar1;
  uint uVar2;
  Chapter *pCVar3;
  undefined1 auVar4 [16];
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  Chapter *pCVar9;
  bool bVar10;
  
  iVar1 = this->chapters_size_;
  uVar2 = this->chapters_count_;
  bVar10 = true;
  if (iVar1 <= (int)uVar2) {
    iVar8 = 1;
    if (iVar1 != 0) {
      iVar8 = iVar1 * 2;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)iVar8;
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
      uVar7 = SUB168(auVar4 * ZEXT816(0x30),0) | 8;
    }
    puVar5 = (ulong *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    if (puVar5 == (ulong *)0x0) {
      pCVar9 = (Chapter *)0x0;
    }
    else {
      *puVar5 = (long)iVar8;
      pCVar9 = (Chapter *)(puVar5 + 1);
    }
    bVar10 = pCVar9 != (Chapter *)0x0;
    if (bVar10) {
      if (0 < (int)uVar2) {
        pCVar3 = this->chapters_;
        lVar6 = 0;
        do {
          *(undefined8 *)((long)&pCVar9->id_ + lVar6) = *(undefined8 *)((long)&pCVar3->id_ + lVar6);
          *(undefined8 *)((long)&pCVar9->start_timecode_ + lVar6) =
               *(undefined8 *)((long)&pCVar3->start_timecode_ + lVar6);
          *(undefined8 *)((long)&pCVar9->end_timecode_ + lVar6) =
               *(undefined8 *)((long)&pCVar3->end_timecode_ + lVar6);
          *(undefined8 *)((long)&pCVar9->uid_ + lVar6) =
               *(undefined8 *)((long)&pCVar3->uid_ + lVar6);
          *(undefined8 *)((long)&pCVar9->displays_ + lVar6) =
               *(undefined8 *)((long)&pCVar3->displays_ + lVar6);
          *(undefined4 *)((long)&pCVar9->displays_size_ + lVar6) =
               *(undefined4 *)((long)&pCVar3->displays_size_ + lVar6);
          *(undefined4 *)((long)&pCVar9->displays_count_ + lVar6) =
               *(undefined4 *)((long)&pCVar3->displays_count_ + lVar6);
          lVar6 = lVar6 + 0x30;
        } while ((ulong)uVar2 * 0x30 != lVar6);
      }
      if (this->chapters_ != (Chapter *)0x0) {
        operator_delete__(&this->chapters_[-1].displays_size_);
      }
      this->chapters_ = pCVar9;
      this->chapters_size_ = iVar8;
    }
  }
  return bVar10;
}

Assistant:

bool Chapters::ExpandChaptersArray() {
  if (chapters_size_ > chapters_count_)
    return true;  // nothing to do yet

  const int size = (chapters_size_ == 0) ? 1 : 2 * chapters_size_;

  Chapter* const chapters = new (std::nothrow) Chapter[size];  // NOLINT
  if (chapters == NULL)
    return false;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& src = chapters_[idx];
    Chapter* const dst = chapters + idx;
    src.ShallowCopy(dst);
  }

  delete[] chapters_;

  chapters_ = chapters;
  chapters_size_ = size;

  return true;
}